

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

vector<duckdb::LogicalType,_true> * __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  undefined8 in_RCX;
  undefined2 in_DX;
  long *in_RSI;
  vector<duckdb::LogicalType,_true> *in_RDI;
  Deserializer *in_stack_00000008;
  type *ret;
  
  (**(code **)(*in_RSI + 0x10))(in_RSI,in_DX,in_RCX);
  Read<duckdb::vector<duckdb::LogicalType,true>>(in_stack_00000008);
  (**(code **)(*in_RSI + 0x18))();
  return in_RDI;
}

Assistant:

inline T ReadProperty(const field_id_t field_id, const char *tag) {
		OnPropertyBegin(field_id, tag);
		auto ret = Read<T>();
		OnPropertyEnd();
		return ret;
	}